

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_directory.cc
# Opt level: O0

void __thiscall
CrailDirectory::CrailDirectory
          (CrailDirectory *this,FileInfo *file_info,shared_ptr<NamenodeClient> *namenode_client,
          shared_ptr<StorageCache> *storage_cache,shared_ptr<BlockCache> *block_cache)

{
  FileInfo *in_RDX;
  shared_ptr<StorageCache> *in_RDI;
  shared_ptr<BlockCache> *in_R8;
  FileInfo *in_stack_ffffffffffffff18;
  int *namenode_client_00;
  FileInfo *file_info_00;
  CrailNode *this_00;
  CrailNode local_80;
  
  namenode_client_00 = &local_80.file_info_.node_type_;
  FileInfo::FileInfo(in_RDX,in_stack_ffffffffffffff18);
  file_info_00 = (FileInfo *)&local_80.file_info_.fd_;
  std::shared_ptr<NamenodeClient>::shared_ptr
            ((shared_ptr<NamenodeClient> *)in_RDX,
             (shared_ptr<NamenodeClient> *)in_stack_ffffffffffffff18);
  this_00 = &local_80;
  std::shared_ptr<StorageCache>::shared_ptr
            ((shared_ptr<StorageCache> *)in_RDX,
             (shared_ptr<StorageCache> *)in_stack_ffffffffffffff18);
  std::shared_ptr<BlockCache>::shared_ptr
            ((shared_ptr<BlockCache> *)in_RDX,(shared_ptr<BlockCache> *)in_stack_ffffffffffffff18);
  CrailNode::CrailNode
            (this_00,file_info_00,(shared_ptr<NamenodeClient> *)namenode_client_00,in_RDI,in_R8);
  std::shared_ptr<BlockCache>::~shared_ptr((shared_ptr<BlockCache> *)0x15ed43);
  std::shared_ptr<StorageCache>::~shared_ptr((shared_ptr<StorageCache> *)0x15ed4d);
  std::shared_ptr<NamenodeClient>::~shared_ptr((shared_ptr<NamenodeClient> *)0x15ed57);
  FileInfo::~FileInfo((FileInfo *)&local_80.file_info_.node_type_);
  (in_RDI->super___shared_ptr<StorageCache,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__CrailDirectory_0018f2b0;
  return;
}

Assistant:

CrailDirectory::CrailDirectory(FileInfo file_info,
                               shared_ptr<NamenodeClient> namenode_client,
                               shared_ptr<StorageCache> storage_cache,
                               shared_ptr<BlockCache> block_cache)
    : CrailNode(file_info, namenode_client, storage_cache, block_cache) {}